

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightweight_test.hpp
# Opt level: O1

void __thiscall
trial::protocol::core::detail::test_close_impl<long_double>
          (detail *this,char *expr1,char *expr2,char *file,int line,char *function,longdouble *lhs,
          longdouble *rhs,longdouble tolerance)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  ostream *poVar3;
  undefined4 in_register_00000084;
  
  if (tolerance < ABS(*(longdouble *)function - *lhs)) {
    __s = (char *)CONCAT44(in_register_00000084,line);
    if (expr2 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1471d0);
    }
    else {
      sVar2 = strlen(expr2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,expr2,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)file);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"): test \'",9);
    iVar1 = (int)poVar3;
    if (this == (detail *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen((char *)this);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)this,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," == ",4);
    if (expr1 == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(expr1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,expr1,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' failed in function \'",0x16);
    if (__s == (char *)0x0) {
      std::ios::clear(iVar1 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,__s,sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\': ",3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    poVar3 = std::ostream::_M_insert<long_double>(*(longdouble *)function);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\' != \'",6);
    poVar3 = std::ostream::_M_insert<long_double>(*lhs);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    test_failure();
    return;
  }
  test_success();
  return;
}

Assistant:

inline void test_close_impl(char const * expr1,
                            char const * expr2,
                            char const * file, int line, char const * function,
                            const T& lhs, const T& rhs, T tolerance)
{
    if (std::fabs(lhs - rhs) <= tolerance)
    {
        test_success();
    }
    else
    {
        BOOST_LIGHTWEIGHT_TEST_OSTREAM
            << file << "(" << line << "): test '" << expr1 << " == " << expr2
            << "' failed in function '" << function << "': "
            << "'" << lhs << "' != '" << rhs << "'" << std::endl;
        test_failure();
    }
}